

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  pointer pvVar3;
  pool<boost::default_user_allocator_malloc_free> *ppVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  __hash_code __code;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_290;
  undefined1 local_278 [8];
  undefined8 local_270;
  shared_count sStack_268;
  char *local_260;
  char *local_258;
  char *local_250;
  _Base_ptr local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  char *local_230;
  char *local_228;
  undefined **local_220;
  undefined1 local_218;
  _Base_ptr local_210;
  _Base_ptr local_208;
  pool<boost::default_user_allocator_malloc_free> *local_1f0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
  local_1e8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  local_1f0 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_1f0->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_1f0->list).ptr = (char *)0x0;
  (local_1f0->list).sz = 0;
  local_1f0->requested_size = 0x30;
  local_1f0->next_size = 0x20;
  local_1f0->start_size = 0x20;
  local_1f0->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
              *)&local_1e8,&local_290,(Column_settings *)local_1f0);
  if (local_290.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_290.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pvVar3 = local_290.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (uint)uVar7;
      if (uVar6 == 5) {
        local_230 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_228 = "";
        local_240 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_238 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x255,
                   &local_240);
        if (local_1e8.reducedMatrixR_.matrix_._M_h._M_buckets
            [uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0
           ) {
LAB_001f5f98:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_1e8.reducedMatrixR_.matrix_._M_h._M_buckets
                 [uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar1 != 5) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
             (ulong)uVar1 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count !=
             uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count)) goto LAB_001f5f98;
        }
        local_278[0] = p_Var2[7]._M_nxt == p_Var2 + 7 || p_Var2[7]._M_nxt == (_Hash_node_base *)0x0;
        local_270 = 0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_250 = "m.get_column(i).is_empty()";
        local_248 = (_Base_ptr)0x20b31a;
        local_218 = _S_red;
        local_220 = &PTR__lazy_ostream_00249168;
        local_210 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_208 = (_Base_ptr)&local_250;
        local_260 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_258 = "";
        boost::test_tools::tt_detail::report_assertion
                  (local_278,
                   (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_220,&local_260,0x255,1,0,0);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
      else {
        if (local_1e8.reducedMatrixR_.matrix_._M_h._M_buckets
            [uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0
           ) {
LAB_001f5f8c:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_1e8.reducedMatrixR_.matrix_._M_h._M_buckets
                 [uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar6 != uVar1) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
             (ulong)uVar1 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count !=
             uVar7 % local_1e8.reducedMatrixR_.matrix_._M_h._M_bucket_count)) goto LAB_001f5f8c;
        }
        get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
                  ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
                    *)&local_220,
                   (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
                    *)(p_Var2 + 2));
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
                  (pvVar3 + uVar7,
                   (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
                    *)&local_220);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_220);
      }
      uVar7 = (ulong)(uVar6 + 1);
      uVar5 = ((long)local_290.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_290.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
  ::reset(&local_1e8,(Column_settings *)local_1f0);
  ppVar4 = local_1f0;
  if (local_1f0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_1f0);
  }
  operator_delete(ppVar4,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
  ::~RU_matrix(&local_1e8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_290);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}